

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

void resist_0_combine_init(int v,int a,ui_entry_combiner_state *st)

{
  int *piVar1;
  
  piVar1 = (int *)mem_alloc(8);
  st->work = piVar1;
  if (v < 0x7ffffffe) {
    if (v == 0x7ffffffd) {
      st->accum = 1;
      v = -1;
    }
    else if (v < 1) {
      st->accum = 0;
    }
    else {
      st->accum = v;
      v = 0;
    }
  }
  else {
    st->accum = v;
  }
  *piVar1 = v;
  if (a < 0x7ffffffe) {
    if (a == 0x7ffffffd) {
      st->accum_aux = 1;
      piVar1[1] = -1;
      return;
    }
    if (0 < a) {
      st->accum_aux = a;
      piVar1[1] = 0;
      return;
    }
    st->accum_aux = 0;
  }
  else {
    st->accum_aux = a;
  }
  piVar1[1] = a;
  return;
}

Assistant:

static void resist_0_combine_init(int v, int a,
	struct ui_entry_combiner_state *st)
{
	/*
	 * Use the accum values in st for the most positive.  Allocate working
	 * space to store the most negative.
	 */
	int *work = mem_alloc(2 * sizeof(*work));

	st->work = work;
	if (v == UI_ENTRY_UNKNOWN_VALUE || v == UI_ENTRY_VALUE_NOT_PRESENT) {
		st->accum = v;
		work[0] = v;
	} else if (v == UI_ENTRY_RESIST0_RES_VUL) {
		st->accum = 1;
		work[0] = -1;
	} else if (v > 0) {
		st->accum = v;
		work[0] = 0;
	} else {
		st->accum = 0;
		work[0] = v;
	}
	if (a == UI_ENTRY_UNKNOWN_VALUE || a == UI_ENTRY_VALUE_NOT_PRESENT) {
		st->accum_aux = a;
		work[1] = a;
	} else if (a == UI_ENTRY_RESIST0_RES_VUL) {
		st->accum_aux = 1;
		work[1] = -1;
	} else if (a > 0) {
		st->accum_aux = a;
		work[1] = 0;
	} else {
		st->accum_aux = 0;
		work[1] = a;
	}
}